

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeTryTable
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name label,Signature sig,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *tags,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *labels,
          vector<bool,_std::allocator<bool>_> *isRefs)

{
  _Variant_storage<false,_wasm::Name,_wasm::Err> *this_00;
  Index *pIVar1;
  TryTable *trytable;
  _Variant_storage<false,_wasm::Name,_wasm::Err> *p_Var2;
  Index *pIVar3;
  Name item;
  undefined1 local_d0 [8];
  Result<wasm::Name> name;
  Result<wasm::Name> _val;
  
  trytable = MixedArena::alloc<wasm::TryTable>(&this->wasm->allocator);
  (trytable->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression.type.id =
       sig.results.id.id;
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&trytable->catchTags,tags);
  ArenaVectorBase<ArenaVector<bool>,bool>::set<std::vector<bool,std::allocator<bool>>>
            ((ArenaVectorBase<ArenaVector<bool>,bool> *)&trytable->catchRefs,isRefs);
  ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::reserve
            (&(trytable->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
             (long)(labels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(labels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 2);
  pIVar3 = (labels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar1 = (labels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = (_Variant_storage<false,_wasm::Name,_wasm::Err> *)
            ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                    super__Move_assign_alias<wasm::Name,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20);
  while( true ) {
    if (pIVar3 == pIVar1) {
      visitTryTableStart(__return_storage_ptr__,this,trytable,label,sig.params.id);
      return __return_storage_ptr__;
    }
    getLabelName((Result<wasm::Name> *)local_d0,this,*pIVar3,false);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)this_00,
               (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)local_d0);
    if (_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\x01') break;
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
              (this_00);
    p_Var2 = (_Variant_storage<false,_wasm::Name,_wasm::Err> *)0x0;
    if (name.val.super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\0') {
      p_Var2 = (_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_d0;
    }
    item.super_IString.str._M_str = (p_Var2->_M_u)._M_first._M_storage.super_IString.str._M_str;
    item.super_IString.str._M_len = (size_t)local_d0;
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back
              (&(trytable->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
               item);
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_d0);
    pIVar3 = pIVar3 + 1;
  }
  std::__cxx11::string::string
            ((string *)
             ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),
             (string *)
             ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
  std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
  _Variant_storage<1ul,wasm::Err>
            ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
             (__index_type *)
             ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
  std::__cxx11::string::~string
            ((string *)
             ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
             ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeTryTable(Name label,
                                 Signature sig,
                                 const std::vector<Name>& tags,
                                 const std::vector<Index>& labels,
                                 const std::vector<bool>& isRefs) {
  auto* trytable = wasm.allocator.alloc<TryTable>();
  trytable->type = sig.results;
  trytable->catchTags.set(tags);
  trytable->catchRefs.set(isRefs);
  trytable->catchDests.reserve(labels.size());
  for (auto label : labels) {
    auto name = getLabelName(label);
    CHECK_ERR(name);
    trytable->catchDests.push_back(*name);
  }
  return visitTryTableStart(trytable, label, sig.params);
}